

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf_v4::load_indices(xr_ogf_v4 *this,xr_reader *r)

{
  uint32_t *puVar1;
  uint uVar2;
  uint *puVar3;
  
  puVar3 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  uVar2 = *puVar3;
  if (((ulong)uVar2 != 0) && (uVar2 % 3 == 0)) {
    xr_ibuf::load(&(this->super_xr_ogf).m_ib,r,(ulong)uVar2);
    puVar1 = &(this->super_xr_ogf).m_loaded;
    *(byte *)puVar1 = (byte)*puVar1 | 0x10;
    return;
  }
  __assert_fail("n && (n % 3) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                ,0x91,"void xray_re::xr_ogf_v4::load_indices(xr_reader &)");
}

Assistant:

inline void xr_ogf_v4::load_indices(xr_reader& r)
{
	size_t n = r.r_u32();
	xr_assert(n && (n % 3) == 0);
	m_ib.load(r, n);
	r.debug_find_chunk();
	set_chunk_loaded(OGF4_INDICES);
}